

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::Exception::Exception(Exception *this,string *t,string *d)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar1 = d->_M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)&bStack_68,(string *)t);
  }
  else {
    std::operator+(&local_48,t,": ");
    std::operator+(&bStack_68,&local_48,d);
  }
  std::logic_error::logic_error(&this->super_logic_error,(string *)&bStack_68);
  std::__cxx11::string::~string((string *)&bStack_68);
  if (sVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  *(undefined ***)this = &PTR__Exception_00168778;
  std::__cxx11::string::string((string *)&this->type,(string *)t);
  std::__cxx11::string::string((string *)&this->detail,(string *)d);
  return;
}

Assistant:

Exception( const std::string& t, const std::string& d )
  : std::logic_error( d.size() ? t + ": " + d : t ),
    type( t ), detail( d )
  {}